

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool __thiscall
tinyusdz::OverridePrimSpec(tinyusdz *this,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream ss_e;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if (dst->_specifier != Over) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"OverridePrimSpec",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_198,0x534);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"src PrimSpec must be qualified with `over` specifier.\n",0x36);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    if (warn != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_1b8);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
    ::std::ios_base::~ios_base(local_128);
  }
  bVar1 = detail::OverridePrimSpecRec(0,(PrimSpec *)this,dst,warn,err);
  return bVar1;
}

Assistant:

bool OverridePrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                      std::string *err) {
  if (src.specifier() != Specifier::Over) {
    PUSH_ERROR("src PrimSpec must be qualified with `over` specifier.\n");
  }

  return detail::OverridePrimSpecRec(0, dst, src, warn, err);
}